

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_test.cpp
# Opt level: O2

void __thiscall
RotateFromTo_Randoms_Test::~RotateFromTo_Randoms_Test(RotateFromTo_Randoms_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RotateFromTo, Randoms) {
    RNG rng;
    for (int i = 0; i < 100; ++i) {
        Vector3f from = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f to = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});

        Transform r = RotateFromTo(from, to);
        Vector3f toNew = r(from);
        EXPECT_LT(std::abs(Length(toNew) - 1), 1e-3f);
        EXPECT_GT(Dot(to, toNew), .999f);
    }
}